

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::CreateTar
               (string *outFileName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,cmTarCompression compressType,bool verbose,string *mtime,string *format,
               int compressionLevel)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  Compress c;
  pointer pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  string e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string cwd;
  string local_330;
  cmArchiveWrite a;
  ofstream fout;
  
  GetCurrentWorkingDirectory_abi_cxx11_();
  std::ofstream::ofstream(&fout,(outFileName->_M_dataplus)._M_p,_S_out|_S_bin);
  if (((&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5)
      == 0) {
    c = CompressNone;
    if (compressType < TarCompressNone) {
      c = *(Compress *)(&DAT_0056a5a0 + (ulong)compressType * 4);
    }
    if (format->_M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&path,"paxr",(allocator<char> *)&local_370);
    }
    else {
      std::__cxx11::string::string((string *)&path,(string *)format);
    }
    cmArchiveWrite::cmArchiveWrite
              (&a,&fout.super_basic_ostream<char,_std::char_traits<char>_>,c,&path,compressionLevel,
               1);
    std::__cxx11::string::~string((string *)&path);
    bVar2 = cmArchiveWrite::Open(&a);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)&a.MTime);
      pbVar1 = (files->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      bVar2 = true;
      a.Verbose = verbose;
      for (pbVar4 = (files->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1;
          pbVar4 = pbVar4 + 1) {
        std::__cxx11::string::string((string *)&path,(string *)pbVar4);
        bVar3 = cmsys::SystemTools::FileIsFullPath(&path);
        if (bVar3) {
          RelativePath(&e,&cwd,&path);
          std::__cxx11::string::operator=((string *)&path,(string *)&e);
          std::__cxx11::string::~string((string *)&e);
        }
        std::__cxx11::string::string((string *)&local_330,(string *)&path);
        bVar3 = cmArchiveWrite::Add(&a,&local_330,0,(char *)0x0,true);
        std::__cxx11::string::~string((string *)&local_330);
        if (!bVar3) {
          std::__cxx11::string::string((string *)&e,(string *)&a.Error);
          Error(&e);
          std::__cxx11::string::~string((string *)&e);
          bVar2 = false;
        }
        std::__cxx11::string::~string((string *)&path);
      }
    }
    else {
      std::__cxx11::string::string((string *)&path,(string *)&a.Error);
      Error(&path);
      std::__cxx11::string::~string((string *)&path);
      bVar2 = false;
    }
    cmArchiveWrite::~cmArchiveWrite(&a);
  }
  else {
    a.Stream = (ostream *)0x19;
    a.Archive = (archive *)anon_var_dwarf_fc0d5;
    path._M_string_length = (size_type)(outFileName->_M_dataplus)._M_p;
    path._M_dataplus._M_p = (pointer)outFileName->_M_string_length;
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    cmStrCat<char[4],std::__cxx11::string>
              (&e,(cmAlphaNum *)&a,(cmAlphaNum *)&path,(char (*) [4])0x57086b,&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    Error(&e);
    std::__cxx11::string::~string((string *)&e);
    bVar2 = false;
  }
  std::ofstream::~ofstream(&fout);
  std::__cxx11::string::~string((string *)&cwd);
  return bVar2;
}

Assistant:

bool cmSystemTools::CreateTar(const std::string& outFileName,
                              const std::vector<std::string>& files,
                              cmTarCompression compressType, bool verbose,
                              std::string const& mtime,
                              std::string const& format, int compressionLevel)
{
#if !defined(CMAKE_BOOTSTRAP)
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  cmsys::ofstream fout(outFileName.c_str(), std::ios::out | std::ios::binary);
  if (!fout) {
    std::string e = cmStrCat("Cannot open output file \"", outFileName,
                             "\": ", cmSystemTools::GetLastSystemError());
    cmSystemTools::Error(e);
    return false;
  }
  cmArchiveWrite::Compress compress = cmArchiveWrite::CompressNone;
  switch (compressType) {
    case TarCompressGZip:
      compress = cmArchiveWrite::CompressGZip;
      break;
    case TarCompressBZip2:
      compress = cmArchiveWrite::CompressBZip2;
      break;
    case TarCompressXZ:
      compress = cmArchiveWrite::CompressXZ;
      break;
    case TarCompressZstd:
      compress = cmArchiveWrite::CompressZstd;
      break;
    case TarCompressNone:
      compress = cmArchiveWrite::CompressNone;
      break;
  }

  cmArchiveWrite a(fout, compress, format.empty() ? "paxr" : format,
                   compressionLevel);

  if (!a.Open()) {
    cmSystemTools::Error(a.GetError());
    return false;
  }
  a.SetMTime(mtime);
  a.SetVerbose(verbose);
  bool tarCreatedSuccessfully = true;
  for (auto path : files) {
    if (cmSystemTools::FileIsFullPath(path)) {
      // Get the relative path to the file.
      path = cmSystemTools::RelativePath(cwd, path);
    }
    if (!a.Add(path)) {
      cmSystemTools::Error(a.GetError());
      tarCreatedSuccessfully = false;
    }
  }
  return tarCreatedSuccessfully;
#else
  (void)outFileName;
  (void)files;
  (void)verbose;
  return false;
#endif
}